

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O2

void api_suite::api_ctor_copy(void)

{
  size_type local_90;
  undefined4 local_84;
  circular_array<int,_4UL> data;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int *local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  data.super_circular_view<int,_4UL>.member.data = (pointer)&data;
  data.super_circular_view<int,_4UL>.member.size = 0;
  data.super_circular_view<int,_4UL>.member.next = 4;
  vista::circular_view<int,_4UL>::push_back(&data.super_circular_view<int,_4UL>,0xb);
  local_48 = &local_58;
  local_58 = data.super_array<int,_4UL>._M_elems[0];
  iStack_54 = data.super_array<int,_4UL>._M_elems[1];
  iStack_50 = data.super_array<int,_4UL>._M_elems[2];
  iStack_4c = data.super_array<int,_4UL>._M_elems[3];
  local_40 = (undefined4)data.super_circular_view<int,_4UL>.member.size;
  uStack_3c = data.super_circular_view<int,_4UL>.member.size._4_4_;
  uStack_38 = (undefined4)data.super_circular_view<int,_4UL>.member.next;
  uStack_34 = data.super_circular_view<int,_4UL>.member.next._4_4_;
  local_90 = data.super_circular_view<int,_4UL>.member.size;
  local_84 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x23,"void api_suite::api_ctor_copy()",&local_90,&local_84);
  local_90 = 4;
  local_84 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x24,"void api_suite::api_ctor_copy()",&local_90,&local_84);
  return;
}

Assistant:

void api_ctor_copy()
{
    circular_array<int, 4> data;
    data.push_back(11);
    circular_array<int, 4> copy(data);
    BOOST_TEST_EQ(copy.size(), 1);
    BOOST_TEST_EQ(copy.capacity(), 4);
}